

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O1

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,16ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  long lVar1;
  long *plVar2;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string<char> *it;
  basic_string<char> *pbVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  plVar4 = *(long **)this;
  uVar5 = *(ulong *)(first + 0x78);
  uVar6 = plVar4[1];
  uVar9 = uVar6;
  if (uVar5 < uVar6) {
    uVar9 = uVar5;
  }
  if (uVar9 != 0) {
    uVar8 = 0;
    uVar12 = 1;
    do {
      cVar3 = *(char *)(*(long *)(first + 0x70) + uVar8);
      if (cVar3 != *(char *)(*plVar4 + uVar8)) {
        bVar13 = cVar3 < *(char *)(*plVar4 + uVar8);
        goto LAB_00189157;
      }
      bVar13 = uVar12 < uVar9;
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar13);
  }
  bVar13 = uVar5 < uVar6;
LAB_00189157:
  if (bVar13) {
    pbVar7 = doitfirst<frozen::basic_string<char>const*,8ul>(this,first + 0x80);
    return pbVar7;
  }
  uVar5 = *(ulong *)(first + 0x38);
  uVar9 = uVar6;
  if (uVar5 < uVar6) {
    uVar9 = uVar5;
  }
  if (uVar9 != 0) {
    uVar8 = 1;
    uVar12 = 0;
    do {
      uVar11 = uVar8;
      cVar3 = *(char *)(*(long *)(first + 0x30) + uVar12);
      if (cVar3 != *(char *)(*plVar4 + uVar12)) {
        bVar13 = cVar3 < *(char *)(*plVar4 + uVar12);
        goto LAB_001891a9;
      }
      uVar8 = (ulong)((int)uVar11 + 1);
      uVar12 = uVar11;
    } while (uVar11 < uVar9);
  }
  bVar13 = uVar5 < uVar6;
LAB_001891a9:
  lVar1 = first + (ulong)bVar13 * 0x40;
  uVar5 = *(ulong *)(first + 0x18 + (ulong)bVar13 * 0x40);
  uVar9 = uVar6;
  if (uVar5 < uVar6) {
    uVar9 = uVar5;
  }
  if (uVar9 != 0) {
    uVar8 = 1;
    uVar12 = 0;
    do {
      uVar11 = uVar8;
      cVar3 = *(char *)(*(long *)(lVar1 + 0x10) + uVar12);
      if (cVar3 != *(char *)(*plVar4 + uVar12)) {
        bVar13 = cVar3 < *(char *)(*plVar4 + uVar12);
        goto LAB_001891f7;
      }
      uVar8 = (ulong)((int)uVar11 + 1);
      uVar12 = uVar11;
    } while (uVar11 < uVar9);
  }
  bVar13 = uVar5 < uVar6;
LAB_001891f7:
  plVar2 = (long *)(lVar1 + (ulong)bVar13 * 0x20);
  uVar5 = *(ulong *)(lVar1 + 8 + (ulong)bVar13 * 0x20);
  uVar9 = uVar6;
  if (uVar5 < uVar6) {
    uVar9 = uVar5;
  }
  if (uVar9 != 0) {
    uVar10 = 1;
    uVar8 = 0;
    do {
      cVar3 = *(char *)(*plVar2 + uVar8);
      if (cVar3 != *(char *)(*plVar4 + uVar8)) {
        bVar13 = cVar3 < *(char *)(*plVar4 + uVar8);
        goto LAB_00189244;
      }
      uVar8 = (ulong)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar8 < uVar9);
  }
  bVar13 = uVar5 < uVar6;
LAB_00189244:
  return (basic_string<char> *)(plVar2 + (ulong)bVar13 * 2);
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }